

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O3

void __thiscall QHostInfoLookupManager::abortLookup(QHostInfoLookupManager *this,int id)

{
  long lVar1;
  QMutex *pQVar2;
  int *piVar3;
  __pointer_type pQVar4;
  long lVar5;
  QHostInfoRunnable *pQVar6;
  long lVar7;
  qsizetype i;
  QList<QHostInfoRunnable_*> *this_00;
  long in_FS_OFFSET;
  bool bVar8;
  int local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = &this->mutex;
  if ((this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar8 = (pQVar2->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar8) {
      (pQVar2->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar8) goto LAB_001ae21e;
  }
  else {
LAB_001ae21e:
    QBasicMutex::lockInternal();
  }
  if ((id != -1) && (this->wasDeleted == false)) {
    lVar5 = (this->postponedLookups).d.size;
    if (lVar5 != 0) {
      i = 0;
      do {
        if ((this->postponedLookups).d.ptr[i]->id == id) {
          this_00 = &this->postponedLookups;
          goto LAB_001ae2ea;
        }
        i = i + 1;
      } while (lVar5 != i);
    }
    lVar5 = (this->scheduledLookups).super_QList<QHostInfoRunnable_*>.d.size;
    if (lVar5 != 0) {
      i = 0;
      do {
        if ((this->scheduledLookups).super_QList<QHostInfoRunnable_*>.d.ptr[i]->id == id) {
          this_00 = &(this->scheduledLookups).super_QList<QHostInfoRunnable_*>;
LAB_001ae2ea:
          pQVar6 = QList<QHostInfoRunnable_*>::takeAt(this_00,i);
          if (pQVar6 != (QHostInfoRunnable *)0x0) {
            (**(code **)(*(long *)pQVar6 + 0x10))(pQVar6);
          }
          goto LAB_001ae300;
        }
        i = i + 1;
      } while (lVar5 != i);
    }
    lVar5 = (this->abortedLookups).d.size;
    if (lVar5 != 0) {
      lVar7 = 0;
      do {
        if (lVar5 * 4 - lVar7 == 0) goto LAB_001ae2bd;
        lVar1 = lVar7 + 4;
        piVar3 = (int *)((long)(this->abortedLookups).d.ptr + lVar7);
        lVar7 = lVar1;
      } while (*piVar3 != id);
      if (lVar1 != 0) goto LAB_001ae300;
    }
LAB_001ae2bd:
    local_24 = id;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)&this->abortedLookups,lVar5,&local_24);
    QList<int>::end(&this->abortedLookups);
  }
LAB_001ae300:
  LOCK();
  pQVar4 = (pQVar2->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (pQVar2->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (pQVar4 != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(pQVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHostInfoLookupManager::abortLookup(int id)
{
    QMutexLocker locker(&this->mutex);

    if (wasDeleted)
        return;

    if (id == -1)
        return;

#if QT_CONFIG(thread)
    // is postponed? delete and return
    for (int i = 0; i < postponedLookups.size(); i++) {
        if (postponedLookups.at(i)->id == id) {
            delete postponedLookups.takeAt(i);
            return;
        }
    }
#endif

    // is scheduled? delete and return
    for (int i = 0; i < scheduledLookups.size(); i++) {
        if (scheduledLookups.at(i)->id == id) {
            delete scheduledLookups.takeAt(i);
            return;
        }
    }

    if (!abortedLookups.contains(id))
        abortedLookups.append(id);
}